

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastErR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  undefined8 uVar2;
  int value;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 data_00;
  ParseContext *extraout_RDX;
  ParseContext *ctx_00;
  ushort *puVar6;
  uint *puVar7;
  RepeatedField<int> *this;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  this = (RepeatedField<int> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  cVar1 = *ptr;
  data_00.data = (ulong)data.field_0 >> 0x18 & 0xff;
  uVar2 = *(undefined8 *)
           ((long)&table->has_bits_offset + data_00.data * 8 + (ulong)table->aux_offset);
  ctx_00 = ctx;
  do {
    uVar4 = (ulong)*(char *)((long)ptr + 1);
    if ((long)uVar4 < 0) {
      data_00.data = (long)(char)*(ushort *)((long)ptr + 2) << 7 | 0x7f;
      if ((long)data_00 < 0) {
        ctx_00 = (ParseContext *)((long)*(char *)((long)ptr + 3) << 0xe | 0x3fff);
        if ((long)ctx_00 < 0) {
          data_00.data = data_00.data & ((long)(char)*(ushort *)((long)ptr + 4) << 0x15 | 0x1fffffU)
          ;
          if ((long)data_00 < 0) {
            ctx_00 = (ParseContext *)
                     ((ulong)ctx_00 & ((long)*(char *)((long)ptr + 5) << 0x1c | 0xfffffffU));
            if ((long)ctx_00 < 0) {
              data_00.data = data_00.data &
                             ((long)(char)*(ushort *)((long)ptr + 6) << 0x23 | 0x7ffffffffU);
              if ((long)data_00 < 0) {
                ctx_00 = (ParseContext *)
                         ((ulong)ctx_00 & ((long)*(char *)((long)ptr + 7) << 0x2a | 0x3ffffffffffU))
                ;
                if ((long)ctx_00 < 0) {
                  data_00.data = data_00.data &
                                 ((long)(char)*(ushort *)((long)ptr + 8) << 0x31 | 0x1ffffffffffffU)
                  ;
                  if ((long)data_00 < 0) {
                    ctx_00 = (ParseContext *)
                             ((ulong)ctx_00 &
                             ((ulong)*(byte *)((long)ptr + 9) << 0x38 | 0xffffffffffffff));
                    if ((long)ctx_00 < 0) {
                      puVar6 = (ushort *)((long)ptr + 0xb);
                      if ((char)*(ushort *)((long)ptr + 10) != '\x01') {
                        if ((char)(byte)*(ushort *)((long)ptr + 10) < '\0') {
                          puVar6 = (ushort *)0x0;
                          goto LAB_00fbccdc;
                        }
                        if (((byte)*(ushort *)((long)ptr + 10) & 1) == 0) {
                          ctx_00 = (ParseContext *)((ulong)ctx_00 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      puVar6 = (ushort *)((long)ptr + 10);
                    }
                  }
                  else {
                    puVar6 = (ushort *)((long)ptr + 9);
                  }
                }
                else {
                  puVar6 = (ushort *)((long)ptr + 8);
                }
              }
              else {
                puVar6 = (ushort *)((long)ptr + 7);
              }
            }
            else {
              puVar6 = (ushort *)((long)ptr + 6);
            }
          }
          else {
            puVar6 = (ushort *)((long)ptr + 5);
          }
        }
        else {
          puVar6 = (ushort *)((long)ptr + 4);
        }
        data_00.data = data_00.data & (ulong)ctx_00;
      }
      else {
        puVar6 = (ushort *)((long)ptr + 3);
      }
      uVar4 = uVar4 & data_00.data;
    }
    else {
      puVar6 = (ushort *)((long)ptr + 2);
    }
LAB_00fbccdc:
    if (puVar6 == (ushort *)0x0) {
      pcVar5 = Error(msg,ptr,ctx_00,(TcFieldData)data_00,table,hasbits);
      return pcVar5;
    }
    value = (int)uVar4;
    if ((value < (int)uVar2) || ((int)((ulong)uVar2 >> 0x20) < value)) {
      pcVar5 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)data_00,table,hasbits);
      return pcVar5;
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar6) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar7 & 3) != 0) {
          AlignFail();
        }
        *puVar7 = *puVar7 | (uint)hasbits;
      }
      return (char *)puVar6;
    }
    ctx_00 = extraout_RDX;
    ptr = (char *)puVar6;
    if ((char)*puVar6 != cVar1) {
      uVar3 = (uint)table->fast_idx_mask & (uint)*puVar6;
      if ((uVar3 & 7) == 0) {
        uVar4 = (ulong)(uVar3 & 0xfffffff8);
        pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                   (msg,puVar6,ctx,
                                    (ulong)*puVar6 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2)
                                    ,table,hasbits);
        return pcVar5;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint8_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}